

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::anon_unknown_0::ComputeNormals
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *vertices,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *normals,
               string *err)

{
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *pvVar1;
  pointer puVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  string *in;
  undefined8 uVar7;
  ulong uVar8;
  pointer paVar9;
  string *args_1;
  pointer pcVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float3 fVar18;
  size_t nv;
  uint32_t vidx2;
  uint32_t vidx1;
  uint32_t vidx0;
  ostringstream ss_e;
  undefined1 local_268 [12];
  undefined4 uStack_25c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  string *local_228;
  unsigned_long local_220;
  float local_214;
  pointer local_210;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *local_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  value_type local_1a8 [9];
  ios_base local_138 [264];
  
  local_1a8[0]._M_elems[0] = 0.0;
  local_1a8[0]._M_elems[1] = 0.0;
  local_1a8[0]._M_elems[2] = 0.0;
  args_1 = err;
  local_1d8 = faceVertexIndices;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::_M_fill_assign
            (normals,((long)(vertices->
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vertices->
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
             local_1a8);
  local_200._16_8_ = 0;
  puVar2 = (faceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  bVar14 = (faceVertexCounts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish == puVar2;
  local_1c0 = faceVertexCounts;
  if (!bVar14) {
    local_210 = (pointer)0x0;
    local_228 = err;
    local_208 = vertices;
    local_200._8_8_ = normals;
    do {
      pvVar1 = local_208;
      local_200._0_8_ = ZEXT48(puVar2[local_200._16_8_]);
      if ((ulong)local_200._0_8_ < (pointer)0x3) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ComputeNormals",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x8c2);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        local_248._0_8_ = &local_238;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"Invalid face num {} at faceVertexCounts[{}]","");
        fmt::format<unsigned_long,unsigned_long>
                  ((string *)local_268,(fmt *)local_248,(string *)local_200,
                   (unsigned_long *)(local_200 + 0x10),(unsigned_long *)args_1);
        poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_268._0_8_,
                            CONCAT44(uStack_25c,local_268._8_4_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._0_8_ != &local_258) {
          operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._0_8_ != &local_238) {
LAB_00350fc8:
          operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
        }
joined_r0x00351529:
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,local_268._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._0_8_ != &local_258) {
            operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
        bVar13 = false;
      }
      else {
        puVar2 = (local_1d8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_1e0._4_4_ = puVar2[(long)local_210];
        uVar12 = (ulong)(uint)local_1e0._4_4_;
        local_1e0._0_4_ = puVar2[(long)(local_210 + 1)];
        uVar4 = (ulong)(uint)local_1e0._0_4_;
        local_200._28_4_ = puVar2[(long)(local_210 + 2)];
        uVar5 = (ulong)(uint)local_200._28_4_;
        paVar9 = (local_208->
                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar8 = ((long)(local_208->
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)paVar9 >> 2) *
                -0x5555555555555555;
        if (uVar8 < uVar12 || uVar8 - uVar12 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ComputeNormals",0xe);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x8cd);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          local_248._0_8_ = &local_238;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,"vertexIndex0 {} exceeds vertices.size {}","");
          local_220 = ((long)(pvVar1->
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar1->
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
          fmt::format<unsigned_int,unsigned_long>
                    ((string *)local_268,(fmt *)local_248,(string *)(local_1e0 + 4),
                     (uint *)&local_220,(unsigned_long *)args_1);
          poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_268._0_8_,
                              CONCAT44(uStack_25c,local_268._8_4_));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._0_8_ != &local_258) {
            operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
          }
          err = local_228;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._0_8_ != &local_238) {
            operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
          }
          goto joined_r0x00351529;
        }
        if (uVar8 < uVar4 || uVar8 - uVar4 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ComputeNormals",0xe);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x8d2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          local_248._0_8_ = &local_238;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,"vertexIndex1 {} exceeds vertices.size {}","");
          lVar11 = (long)(local_208->
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_208->
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
          in = (string *)local_1e0;
LAB_0035179f:
          local_220 = (lVar11 >> 2) * -0x5555555555555555;
          fmt::format<unsigned_int,unsigned_long>
                    ((string *)local_268,(fmt *)local_248,in,(uint *)&local_220,
                     (unsigned_long *)args_1);
          poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_268._0_8_,
                              CONCAT44(uStack_25c,local_268._8_4_));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._0_8_ != &local_258) {
            operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
          }
          err = local_228;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._0_8_ != &local_238) goto LAB_00350fc8;
          goto joined_r0x00351529;
        }
        if (uVar8 < uVar5 || uVar8 - uVar5 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ComputeNormals",0xe);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x8d7);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          local_248._0_8_ = &local_238;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,"vertexIndex2 {} exceeds vertices.size {}","");
          lVar11 = (long)(local_208->
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_208->
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
          in = (string *)(local_200 + 0x1c);
          goto LAB_0035179f;
        }
        fVar15 = (float)*(undefined8 *)paVar9[uVar12]._M_elems;
        fVar16 = (float)((ulong)*(undefined8 *)paVar9[uVar12]._M_elems >> 0x20);
        local_268._0_8_ =
             CONCAT44((float)((ulong)*(undefined8 *)paVar9[uVar4]._M_elems >> 0x20) - fVar16,
                      (float)*(undefined8 *)paVar9[uVar4]._M_elems - fVar15);
        local_268._8_4_ = paVar9[uVar4]._M_elems[2] - paVar9[uVar12]._M_elems[2];
        local_248._0_8_ =
             CONCAT44((float)((ulong)*(undefined8 *)paVar9[uVar5]._M_elems >> 0x20) - fVar16,
                      (float)*(undefined8 *)paVar9[uVar5]._M_elems - fVar15);
        local_248._8_4_ = paVar9[uVar5]._M_elems[2] - paVar9[uVar12]._M_elems[2];
        fVar18 = vcross((float3 *)local_268,(float3 *)local_248);
        local_1a8[0]._M_elems[2] = fVar18._M_elems[2];
        local_1a8[0]._M_elems._0_8_ = fVar18._M_elems._0_8_;
        local_214 = vlength(local_1a8);
        fVar18 = vnormalize(local_1a8,1.1920929e-07);
        fVar15 = fVar18._M_elems[1];
        bVar13 = (pointer)local_200._0_8_ == (pointer)0x0;
        if (!bVar13) {
          local_214 = local_214 * 0.5;
          local_200._24_4_ = local_214 * fVar18._M_elems[0];
          fVar16 = fVar15 * local_214;
          fVar17 = local_214 * fVar18._M_elems[2];
          uVar6 = (long)local_210 * 4;
          pcVar10 = (pointer)0x0;
          local_214 = fVar17;
          local_1d0._M_allocated_capacity = uVar6;
          local_1b8 = fVar16;
          fStack_1b4 = fVar15;
          fStack_1b0 = fVar15;
          fStack_1ac = fVar15;
          do {
            pvVar1 = local_208;
            uVar7 = ZEXT48(*(uint *)((long)(local_1d8->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_start +
                                    (long)pcVar10 * 4 + uVar6));
            uVar12 = ((long)(local_208->
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_208->
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
            if (uVar12 < (ulong)uVar7 || uVar12 - uVar7 == 0) {
              local_1d0._8_8_ = uVar7;
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ComputeNormals",0xe);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x8e2);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
              local_248._0_8_ = &local_238;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_248,"vertexIndex exceeds vertices.size {}","");
              local_220 = ((long)(pvVar1->
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar1->
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 2) *
                          -0x5555555555555555;
              fmt::format<unsigned_long>((string *)local_268,(string *)local_248,&local_220);
              poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)local_268._0_8_,
                                  CONCAT44(uStack_25c,local_268._8_4_));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._0_8_ != &local_258) {
                operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._0_8_ != &local_238) {
                operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
              }
              if (local_228 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)local_228,local_268._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._0_8_ != &local_258) {
                  operator_delete((void *)local_268._0_8_,local_258._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              uVar6 = local_1d0._M_allocated_capacity;
              uVar7 = local_1d0._8_8_;
              fVar16 = local_1b8;
              fVar17 = local_214;
            }
            else {
              paVar9 = (((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          *)local_200._8_8_)->_M_impl).super__Vector_impl_data._M_start;
              paVar9[uVar7]._M_elems[0] = paVar9[uVar7]._M_elems[0] + (float)local_200._24_4_;
              paVar9[uVar7]._M_elems[1] = paVar9[uVar7]._M_elems[1] + fVar16;
              paVar9[uVar7]._M_elems[2] = paVar9[uVar7]._M_elems[2] + fVar17;
            }
            normals = (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      local_200._8_8_;
            err = local_228;
            if (uVar12 < (ulong)uVar7 || uVar12 - uVar7 == 0) goto LAB_0035158f;
            pcVar10 = pcVar10 + 1;
            bVar13 = pcVar10 >= (ulong)local_200._0_8_;
          } while (pcVar10 < (ulong)local_200._0_8_);
        }
        local_210 = local_210 + local_200._0_8_;
        normals = (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                  local_200._8_8_;
        err = local_228;
      }
LAB_0035158f:
      if (!bVar13) {
        return bVar14;
      }
      local_200._16_8_ = local_200._16_8_ + 1;
      puVar2 = (local_1c0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar13 = (ulong)local_200._16_8_ <
               (ulong)((long)(local_1c0->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2);
      bVar14 = !bVar13;
    } while (bVar13);
  }
  paVar9 = (normals->
           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((normals->super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != paVar9) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      fVar18 = vnormalize((float3 *)((long)paVar9->_M_elems + lVar11),1.1920929e-07);
      paVar9 = (normals->
               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      *(long *)((long)paVar9->_M_elems + lVar11) = fVar18._M_elems._0_8_;
      *(float *)((long)paVar9->_M_elems + lVar11 + 8) = fVar18._M_elems[2];
      uVar12 = uVar12 + 1;
      paVar9 = (normals->
               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0xc;
    } while (uVar12 < (ulong)(((long)(normals->
                                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)paVar9 >> 2
                              ) * -0x5555555555555555));
  }
  return bVar14;
}

Assistant:

static bool ComputeNormals(const std::vector<vec3> &vertices,
                           const std::vector<uint32_t> &faceVertexCounts,
                           const std::vector<uint32_t> &faceVertexIndices,
                           std::vector<vec3> &normals, std::string *err) {
  normals.assign(vertices.size(), {0.0f, 0.0f, 0.0f});

  size_t faceVertexIndexOffset{0};
  for (size_t f = 0; f < faceVertexCounts.size(); f++) {
    size_t nv = faceVertexCounts[f];

    if (nv < 3) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Invalid face num {} at faceVertexCounts[{}]", nv, f));
    }

    // For quad/polygon, first three vertices are used to compute face normal
    // (Assume quad/polygon plane is co-planar)
    uint32_t vidx0 = faceVertexIndices[faceVertexIndexOffset + 0];
    uint32_t vidx1 = faceVertexIndices[faceVertexIndexOffset + 1];
    uint32_t vidx2 = faceVertexIndices[faceVertexIndexOffset + 2];

    if (vidx0 >= vertices.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("vertexIndex0 {} exceeds vertices.size {}", vidx0, vertices.size()));
    }

    if (vidx1 >= vertices.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("vertexIndex1 {} exceeds vertices.size {}", vidx1, vertices.size()));
    }

    if (vidx2 >= vertices.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("vertexIndex2 {} exceeds vertices.size {}", vidx2, vertices.size()));
    }

    float area{0.0f};
    value::float3 Nf = GeometricNormal(vertices[vidx0], vertices[vidx1],
                                       vertices[vidx2], area);

    for (size_t v = 0; v < nv; v++) {
      uint32_t vidx = faceVertexIndices[faceVertexIndexOffset + v];
      if (vidx >= vertices.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "vertexIndex exceeds vertices.size {}", vertices.size()));
      }
      normals[vidx] += area * Nf;
    }

    faceVertexIndexOffset += nv;
  }

  for (size_t v = 0; v < normals.size(); v++) {
    normals[v] = vnormalize(normals[v]);
  }

  return true;
}